

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_1::AttachmentSizeInitialCase::test
          (AttachmentSizeInitialCase *this)

{
  GLenum attachment;
  int g;
  TestContext *pTVar1;
  bool bVar2;
  RenderTarget *pRVar3;
  int s;
  int iVar4;
  
  bVar2 = attachmentExists(this,0x405);
  if (bVar2) {
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    pRVar3 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
    attachment = (pRVar3->m_pixelFormat).redBits;
    pRVar3 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
    iVar4 = (pRVar3->m_pixelFormat).greenBits;
    pRVar3 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
    g = (pRVar3->m_pixelFormat).blueBits;
    s = 0x639927;
    pRVar3 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
    checkAttachmentComponentSizeAtLeast
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,0x405,attachment,iVar4,g,
               (pRVar3->m_pixelFormat).alphaBits,-1,-1,s);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  bVar2 = attachmentExists(this,0x1801);
  if (bVar2) {
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    iVar4 = 0x63997b;
    pRVar3 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
    checkAttachmentComponentSizeAtLeast
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,0x1801,0xffffffff,-1,-1,-1,
               pRVar3->m_depthBits,-1,iVar4);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  bVar2 = attachmentExists(this,0x1802);
  if (bVar2) {
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    iVar4 = 0x6399d0;
    pRVar3 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
    checkAttachmentComponentSizeAtLeast
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,0x1802,0xffffffff,-1,-1,-1,-1,
               pRVar3->m_stencilBits,iVar4);
    ApiCase::expectError(&this->super_ApiCase,0);
    return;
  }
  return;
}

Assistant:

void test (void)
	{
		// check default
		if (attachmentExists(GL_BACK))
		{
			checkAttachmentComponentSizeAtLeast(
				m_testCtx,
				*this,
				GL_FRAMEBUFFER,
				GL_BACK,
				m_context.getRenderTarget().getPixelFormat().redBits,
				m_context.getRenderTarget().getPixelFormat().greenBits,
				m_context.getRenderTarget().getPixelFormat().blueBits,
				m_context.getRenderTarget().getPixelFormat().alphaBits,
				-1,
				-1);
			expectError(GL_NO_ERROR);
		}

		if (attachmentExists(GL_DEPTH))
		{
			checkAttachmentComponentSizeAtLeast(
				m_testCtx,
				*this,
				GL_FRAMEBUFFER,
				GL_DEPTH,
				-1,
				-1,
				-1,
				-1,
				m_context.getRenderTarget().getDepthBits(),
				-1);
			expectError(GL_NO_ERROR);
		}

		if (attachmentExists(GL_STENCIL))
		{
			checkAttachmentComponentSizeAtLeast(
				m_testCtx,
				*this,
				GL_FRAMEBUFFER,
				GL_STENCIL,
				-1,
				-1,
				-1,
				-1,
				-1,
				m_context.getRenderTarget().getStencilBits());
			expectError(GL_NO_ERROR);
		}
	}